

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

void __thiscall BattleWithLandlord::PrintCards(BattleWithLandlord *this)

{
  ostream *poVar1;
  string local_58 [48];
  string local_28 [8];
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  BattleWithLandlord *in_stack_ffffffffffffffe8;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"cards0: ");
  Translate_abi_cxx11_(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  poVar1 = std::operator<<(poVar1,local_28);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"cards1: ");
  Translate_abi_cxx11_(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  poVar1 = std::operator<<(poVar1,local_58);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void BattleWithLandlord::PrintCards() {
    cout << "cards0: " << Translate(_cards[0]) << endl;
    cout << "cards1: " << Translate(_cards[1]) << endl;
}